

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

bool __thiscall CaDiCaL::Internal::disconnect_proof_tracer(Internal *this,StatTracer *tracer)

{
  bool bVar1;
  iterator __position;
  Tracer *in_RSI;
  Proof *in_RDI;
  __normal_iterator<CaDiCaL::StatTracer_**,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
  it;
  vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_> *in_stack_ffffffffffffffa8;
  StatTracer **in_stack_ffffffffffffffb8;
  __normal_iterator<CaDiCaL::StatTracer_**,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<CaDiCaL::StatTracer_**,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
  in_stack_ffffffffffffffc8;
  Proof *this_00;
  
  this_00 = in_RDI;
  std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>::begin
            (in_stack_ffffffffffffffa8);
  std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>::end
            (in_stack_ffffffffffffffa8);
  std::
  find<__gnu_cxx::__normal_iterator<CaDiCaL::StatTracer**,std::vector<CaDiCaL::StatTracer*,std::allocator<CaDiCaL::StatTracer*>>>,CaDiCaL::StatTracer*>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  __position = std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>::end
                         (in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<CaDiCaL::StatTracer_**,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
                      *)in_RDI,
                     (__normal_iterator<CaDiCaL::StatTracer_**,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
                      *)in_stack_ffffffffffffffa8);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<CaDiCaL::StatTracer*const*,std::vector<CaDiCaL::StatTracer*,std::allocator<CaDiCaL::StatTracer*>>>
    ::__normal_iterator<CaDiCaL::StatTracer**>
              ((__normal_iterator<CaDiCaL::StatTracer_*const_*,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
                *)in_RDI,
               (__normal_iterator<CaDiCaL::StatTracer_**,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
                *)&in_RDI[0x18].file_tracers);
    std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>::erase
              ((vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_> *)
               in_stack_ffffffffffffffc0._M_current,(const_iterator)__position._M_current);
    Proof::disconnect(this_00,in_RSI);
  }
  return bVar1;
}

Assistant:

bool Internal::disconnect_proof_tracer (StatTracer *tracer) {
  auto it = std::find (stat_tracers.begin (), stat_tracers.end (), tracer);
  if (it != stat_tracers.end ()) {
    stat_tracers.erase (it);
    assert (proof);
    proof->disconnect (tracer);
    return true;
  }
  return false;
}